

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optTyped_otherTypeCopyConstructionForEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
::TestBody(optTyped_otherTypeCopyConstructionForEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
           *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_1f0;
  Message local_1e8;
  double local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_1;
  Message local_1c0 [2];
  bad_optional_access *anon_var_0_1;
  char *pcStack_1a8;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  AssertHelper local_180;
  Message local_178;
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_138;
  Message local_130;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__2;
  Message local_108;
  float local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  Message local_e0 [2];
  bad_optional_access *anon_var_0;
  char *pcStack_c8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AssertHelper local_a0;
  Message local_98;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_58 [3];
  Message local_40;
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  opt_type o2;
  other_opt_type o1;
  optTyped_otherTypeCopyConstructionForEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
  *this_local;
  
  mp::opt<float,_mp::opt_null_type_policy<float,_(anonymous_namespace)::null_floating<float>_>_>::
  opt((opt<float,_mp::opt_null_type_policy<float,_(anonymous_namespace)::null_floating<float>_>_> *)
      ((long)&o2.storage_ + 4));
  mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>
  ::
  opt<float,_mp::opt_null_type_policy<float,_(anonymous_namespace)::null_floating<float>_>,_true,_true>
            ((opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>
              *)&gtest_ar_.message_,
             (opt<float,_mp::opt_null_type_policy<float,_(anonymous_namespace)::null_floating<float>_>_>
              *)((long)&o2.storage_ + 4));
  bVar1 = mp::opt::operator_cast_to_bool((opt *)((long)&o2.storage_ + 4));
  local_31 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_30,(AssertionResult *)0x20bf26,
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1d7,pcVar2);
    testing::internal::AssertHelper::operator=(local_58,&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  bVar1 = mp::
          opt<float,_mp::opt_null_type_policy<float,_(anonymous_namespace)::null_floating<float>_>_>
          ::has_value((opt<float,_mp::opt_null_type_policy<float,_(anonymous_namespace)::null_floating<float>_>_>
                       *)((long)&o2.storage_ + 4));
  local_89 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_msg,(internal *)local_88,(AssertionResult *)"o1.has_value()","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1d8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&gtest_msg);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff38,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff38);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::opt<float,_mp::opt_null_type_policy<float,_(anonymous_namespace)::null_floating<float>_>_>
      ::value((opt<float,_mp::opt_null_type_policy<float,_(anonymous_namespace)::null_floating<float>_>_>
               *)((long)&o2.storage_ + 4));
    }
    if ((anon_var_0._7_1_ & 1) == 0) {
      pcStack_c8 = 
      "Expected: o1.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
      ;
      goto LAB_0015cb5d;
    }
  }
  else {
LAB_0015cb5d:
    testing::Message::Message(local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1d9,pcStack_c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_e0);
  }
  local_fc = mp::
             opt<float,mp::opt_null_type_policy<float,(anonymous_namespace)::null_floating<float>>>
             ::value_or<float_const&>
                       ((opt<float,mp::opt_null_type_policy<float,(anonymous_namespace)::null_floating<float>>>
                         *)((long)&o2.storage_ + 4),
                        &(this->
                         super_optTyped<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
                         ).other_value_2);
  testing::internal::EqHelper<false>::Compare<double,float>
            ((EqHelper<false> *)local_f8,"this->value_2","o1.value_or(this->other_value_2)",
             &(this->
              super_optTyped<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
              ).value_2,&local_fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1da,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  bVar1 = mp::opt::operator_cast_to_bool((opt *)&gtest_ar_.message_);
  local_121 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_120,(AssertionResult *)0x20b8e9,
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1db,pcVar2);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  bVar1 = mp::
          opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>
          ::has_value((opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>
                       *)&gtest_ar_.message_);
  local_169 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_168,&local_169,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_msg_1,(internal *)local_168,(AssertionResult *)"o2.has_value()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1dc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    std::__cxx11::string::~string((string *)&gtest_msg_1);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe58,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe58);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::
      opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>
      ::value((opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>
               *)&gtest_ar_.message_);
    }
    if ((anon_var_0_1._7_1_ & 1) != 0) goto LAB_0015d165;
    pcStack_1a8 = 
    "Expected: o2.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_1c0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x1dd,pcStack_1a8);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_1c0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
  testing::Message::~Message(local_1c0);
LAB_0015d165:
  local_1e0 = mp::
              opt<double,mp::opt_null_type_policy<double,(anonymous_namespace)::null_floating<double>>>
              ::value_or<double_const&>
                        ((opt<double,mp::opt_null_type_policy<double,(anonymous_namespace)::null_floating<double>>>
                          *)&gtest_ar_.message_,
                         &(this->
                          super_optTyped<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
                          ).value_2);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_1d8,"this->value_2","o2.value_or(this->value_2)",
             &(this->
              super_optTyped<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
              ).value_2,&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1de,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  return;
}

Assistant:

TYPED_TEST(optTyped, otherTypeCopyConstructionForEmpty)
{
  using opt_type = typename TestFixture::type;
  using other_opt_type = opt<typename TestFixture::traits::other_type, typename TestFixture::traits::other_policy_type>;
  other_opt_type o1;
  opt_type o2{o1};
  EXPECT_FALSE(o1);
  EXPECT_FALSE(o1.has_value());
  EXPECT_THROW(o1.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o1.value_or(this->other_value_2));
  EXPECT_FALSE(o2);
  EXPECT_FALSE(o2.has_value());
  EXPECT_THROW(o2.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o2.value_or(this->value_2));
}